

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_tEXt(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  bool bVar1;
  ulong local_50;
  uint local_40;
  uint string2_begin;
  uint length;
  uint i;
  char *str;
  char *key;
  uint error;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGInfo *info_local;
  
  str = (char *)0x0;
  _length = (char *)0x0;
  local_40 = 0;
  while( true ) {
    bVar1 = false;
    if (local_40 < chunkLength) {
      bVar1 = data[local_40] != '\0';
    }
    if (!bVar1) break;
    local_40 = local_40 + 1;
  }
  if ((local_40 == 0) || (0x4f < local_40)) {
    key._4_4_ = 0x59;
  }
  else {
    str = (char *)lodepng_malloc((ulong)(local_40 + 1));
    if (str == (char *)0x0) {
      key._4_4_ = 0x53;
    }
    else {
      str[local_40] = '\0';
      for (string2_begin = 0; string2_begin != local_40; string2_begin = string2_begin + 1) {
        str[string2_begin] = data[string2_begin];
      }
      local_40 = local_40 + 1;
      if (chunkLength < local_40) {
        local_50 = 0;
      }
      else {
        local_50 = chunkLength - local_40;
      }
      _length = (char *)lodepng_malloc((ulong)((uint)local_50 + 1));
      if (_length == (char *)0x0) {
        key._4_4_ = 0x53;
      }
      else {
        _length[local_50 & 0xffffffff] = '\0';
        for (string2_begin = 0; string2_begin != (uint)local_50; string2_begin = string2_begin + 1)
        {
          _length[string2_begin] = data[local_40 + string2_begin];
        }
        key._4_4_ = lodepng_add_text(info,str,_length);
      }
    }
  }
  lodepng_free(str);
  lodepng_free(_length);
  return key._4_4_;
}

Assistant:

static unsigned readChunk_tEXt(LodePNGInfo* info, const unsigned char* data, size_t chunkLength)
{
  unsigned error = 0;
  char *key = 0, *str = 0;
  unsigned i;

  while(!error) /*not really a while loop, only used to break on error*/
  {
    unsigned length, string2_begin;

    length = 0;
    while(length < chunkLength && data[length] != 0) ++length;
    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    string2_begin = length + 1; /*skip keyword null terminator*/

    length = chunkLength < string2_begin ? 0 : chunkLength - string2_begin;
    str = (char*)lodepng_malloc(length + 1);
    if(!str) CERROR_BREAK(error, 83); /*alloc fail*/

    str[length] = 0;
    for(i = 0; i != length; ++i) str[i] = (char)data[string2_begin + i];

    error = lodepng_add_text(info, key, str);

    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}